

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

void __thiscall
libwebm::vttdemux::FrameParser::FrameParser(FrameParser *this,BlockGroup *block_group)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  Frame *pFVar3;
  
  (this->super_LineReader).super_Reader._vptr_Reader = (_func_int **)&PTR_GetChar_00124b00;
  this->block_group_ = block_group;
  iVar2 = (*(block_group->super_BlockEntry)._vptr_BlockEntry[2])(block_group);
  pFVar3 = mkvparser::Block::GetFrame((Block *)CONCAT44(extraout_var,iVar2),0);
  lVar1 = pFVar3->pos;
  this->pos_ = lVar1;
  this->pos_end_ = lVar1 + pFVar3->len;
  return;
}

Assistant:

FrameParser::FrameParser(const mkvparser::BlockGroup* block_group)
    : block_group_(block_group) {
  const mkvparser::Block* const block = block_group->GetBlock();
  const mkvparser::Block::Frame& f = block->GetFrame(0);

  // The beginning and end of the character stream corresponds to the
  // position of this block's frame within the WebM input file.

  pos_ = f.pos;
  pos_end_ = f.pos + f.len;
}